

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O0

void __thiscall StunMsg_RFC5769SampleRequest_Test::TestBody(StunMsg_RFC5769SampleRequest_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_hdr_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_4e0;
  Message local_4d8;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_15;
  Message local_4b8;
  uint16_t local_4ae;
  stun_attr_type local_4ac;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_14;
  Message local_490;
  int local_488 [2];
  undefined1 local_480 [8];
  AssertionResult gtest_ar_13;
  Message local_468;
  uint16_t local_45e;
  stun_attr_type local_45c;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_428;
  Message local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar__2;
  Message local_400;
  size_t local_3f8;
  unsigned_long local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_11;
  Message local_3d0;
  uint16_t local_3c6;
  stun_attr_type local_3c4;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_10;
  Message local_3a8;
  uint64_t local_3a0;
  unsigned_long_long local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_9;
  Message local_378;
  uint16_t local_36e;
  stun_attr_type local_36c;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_8;
  Message local_350;
  uint32_t local_344;
  unsigned_long local_340;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_7;
  Message local_320;
  uint16_t local_316;
  stun_attr_type local_314;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__1;
  void *data;
  Message local_2b0;
  size_t local_2a8;
  unsigned_long local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_5;
  Message local_280;
  uint16_t local_276;
  stun_attr_type local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_4;
  stun_attr_hdr *attr_hdr;
  Message local_250;
  size_t local_248;
  unsigned_long local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_3;
  Message local_220;
  uint16_t local_216;
  stun_msg_type local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1e0;
  Message local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_;
  stun_msg_hdr *msg_hdr;
  Message local_1b0;
  int local_1a8 [2];
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_188;
  Message local_180 [3];
  unsigned_long local_168 [2];
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  uint8_t tsx_id [12];
  uint8_t buffer [108];
  uint8_t expected_result [108];
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char password [23];
  undefined8 local_38;
  char username [10];
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char software_name [17];
  StunMsg_RFC5769SampleRequest_Test *this_local;
  
  username[8] = 'S';
  username[9] = 'T';
  cStack_26 = 'U';
  cStack_25 = 'N';
  cStack_24 = ' ';
  cStack_23 = 't';
  cStack_22 = 'e';
  cStack_21 = 's';
  local_38 = 0x7636683a6a747665;
  username[0] = 'Y';
  username[1] = '\0';
  builtin_memcpy(expected_result + 0x68,"VOkJ",4);
  cStack_54 = 'x';
  cStack_53 = 'b';
  cStack_52 = 'R';
  cStack_51 = 'l';
  expected_result[0x58] = 0xc1;
  expected_result[0x59] = 0xb5;
  expected_result[0x5a] = 'q';
  expected_result[0x5b] = 0xa2;
  expected_result[0x5c] = 0x80;
  expected_result[0x5d] = '(';
  expected_result[0x5e] = '\0';
  expected_result[0x5f] = '\x04';
  expected_result[0x60] = 0xe5;
  expected_result[0x61] = 'z';
  expected_result[0x62] = ';';
  expected_result[99] = 0xcf;
  expected_result[0x48] = 0x9a;
  expected_result[0x49] = 0xea;
  expected_result[0x4a] = 0xa7;
  expected_result[0x4b] = '\f';
  expected_result[0x4c] = 0xbf;
  expected_result[0x4d] = 0xd8;
  expected_result[0x4e] = 0xcb;
  expected_result[0x4f] = 'V';
  expected_result[0x50] = 'x';
  expected_result[0x51] = '\x1e';
  expected_result[0x52] = 0xf2;
  expected_result[0x53] = 0xb5;
  expected_result[0x54] = 0xb2;
  expected_result[0x55] = 0xd3;
  expected_result[0x56] = 0xf2;
  expected_result[0x57] = 'I';
  builtin_memcpy(expected_result + 0x38,"evtj:h6vY   ",0xd);
  expected_result[0x45] = '\b';
  expected_result[0x46] = '\0';
  expected_result[0x47] = '\x14';
  expected_result[0x28] = 0x80;
  expected_result[0x29] = ')';
  expected_result[0x2a] = '\0';
  expected_result[0x2b] = '\b';
  expected_result[0x2c] = 0x93;
  expected_result[0x2d] = '/';
  expected_result[0x2e] = 0xf9;
  expected_result[0x2f] = 0xb1;
  expected_result[0x30] = 'Q';
  expected_result[0x31] = '&';
  expected_result[0x32] = ';';
  expected_result[0x33] = '6';
  expected_result[0x34] = '\0';
  expected_result[0x35] = '\x06';
  expected_result[0x36] = '\0';
  expected_result[0x37] = '\t';
  builtin_memcpy(expected_result + 0x18,"t client",9);
  expected_result[0x21] = '$';
  expected_result[0x22] = '\0';
  expected_result[0x23] = '\x04';
  expected_result[0x24] = 'n';
  expected_result[0x25] = '\0';
  expected_result[0x26] = '\x01';
  expected_result[0x27] = 0xff;
  expected_result[8] = 0xfa;
  expected_result[9] = 0x87;
  expected_result[10] = 0xdf;
  expected_result[0xb] = 0xae;
  expected_result[0xc] = 0x80;
  expected_result[0xd] = '\"';
  expected_result[0xe] = '\0';
  expected_result[0xf] = '\x10';
  expected_result[0x10] = 'S';
  expected_result[0x11] = 'T';
  expected_result[0x12] = 'U';
  expected_result[0x13] = 'N';
  expected_result[0x14] = ' ';
  expected_result[0x15] = 't';
  expected_result[0x16] = 'e';
  expected_result[0x17] = 's';
  stack0xffffffffffffff38 = 0x42a4122158000100;
  expected_result[0] = 0xb7;
  expected_result[1] = 0xe7;
  expected_result[2] = 0xa7;
  expected_result[3] = '\x01';
  expected_result[4] = 0xbc;
  expected_result[5] = '4';
  expected_result[6] = 0xd6;
  expected_result[7] = 0x86;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x86d634bc01a7e7b7;
  tsx_id[0] = 0xfa;
  tsx_id[1] = 0x87;
  tsx_id[2] = 0xdf;
  tsx_id[3] = 0xae;
  local_168[1] = 0x6c;
  local_168[0] = 0x6c;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_158,"sizeof(expected_result)","sizeof(buffer)",local_168 + 1,
             local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_188,local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message(local_180);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_1a8[1] = 1;
    local_1a8[0] = stun_msg_verify((stun_msg_hdr *)(buffer + 0x68),0x6c);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_1a0,"1",
               "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
               local_1a8 + 1,local_1a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&msg_hdr,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0xa2,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&msg_hdr,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&msg_hdr);
      testing::Message::~Message(&local_1b0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      msg_hdr_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(tsx_id + 8)
      ;
      gtest_ar_.message_.ptr_ = msg_hdr_00;
      stun_msg_hdr_init((stun_msg_hdr *)msg_hdr_00,1,(uint8_t *)&gtest_ar.message_);
      stun_attr_varsize_add((stun_msg_hdr *)gtest_ar_.message_.ptr_,0x8022,username + 8,0x10,' ');
      stun_attr_uint32_add((stun_msg_hdr *)gtest_ar_.message_.ptr_,0x24,0x6e0001ff);
      stun_attr_uint64_add((stun_msg_hdr *)gtest_ar_.message_.ptr_,0x8029,0x932ff9b151263b36);
      stun_attr_varsize_add((stun_msg_hdr *)gtest_ar_.message_.ptr_,6,&local_38,9,' ');
      stun_attr_msgint_add((stun_msg_hdr *)gtest_ar_.message_.ptr_,expected_result + 0x68,0x16);
      stun_attr_fingerprint_add((stun_msg_hdr *)gtest_ar_.message_.ptr_);
      anon_unknown.dwarf_39c4::IsEqual
                ((anon_unknown_dwarf_39c4 *)local_1d0,buffer + 0x68,msg_hdr_00,0x6c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
      if (!bVar1) {
        testing::Message::Message(&local_1d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_1d0,
                   (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
                   "false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
        testing::internal::AssertHelper::~AssertHelper(&local_1e0);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(buffer + 0x68);
      local_214 = STUN_BINDING_REQUEST;
      local_216 = stun_msg_type((stun_msg_hdr *)gtest_ar_.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<stun_msg_type,unsigned_short>
                ((EqHelper<false> *)local_210,"STUN_BINDING_REQUEST","stun_msg_type(msg_hdr)",
                 &local_214,&local_216);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
      if (!bVar1) {
        testing::Message::Message(&local_220);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb4,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_220);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_220);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
      local_240 = 0x6c;
      local_248 = stun_msg_len((stun_msg_hdr *)gtest_ar_.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_238,"sizeof(expected_result)","stun_msg_len(msg_hdr)",
                 &local_240,&local_248);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
      if (!bVar1) {
        testing::Message::Message(&local_250);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&attr_hdr,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb5,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&attr_hdr,&local_250);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&attr_hdr);
        testing::Message::~Message(&local_250);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
      gtest_ar_4.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           stun_msg_next_attr(gtest_ar_.message_.ptr_,(stun_attr_hdr *)0x0);
      local_274 = STUN_ATTR_SOFTWARE;
      local_276 = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                ((EqHelper<false> *)local_270,"STUN_ATTR_SOFTWARE","stun_attr_type(attr_hdr)",
                 &local_274,&local_276);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
      if (!bVar1) {
        testing::Message::Message(&local_280);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb8,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_280);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_280);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
      local_2a0 = 0x10;
      local_2a8 = stun_attr_len((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_298,"sizeof(software_name)-1","stun_attr_len(attr_hdr)",
                 &local_2a0,&local_2a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
      if (!bVar1) {
        testing::Message::Message(&local_2b0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&data,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb9,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&data,&local_2b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&data);
        testing::Message::~Message(&local_2b0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        gtest_ar__1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_attr_varsize_read(gtest_ar_4.message_.ptr_);
        anon_unknown.dwarf_39c4::IsEqual
                  ((anon_unknown_dwarf_39c4 *)local_2d0,gtest_ar__1.message_.ptr_,username + 8,0x10)
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
        if (!bVar1) {
          testing::Message::Message(&local_2d8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_6.message_,(internal *)local_2d0,
                     (AssertionResult *)"IsEqual(data, software_name, sizeof(software_name)-1)",
                     "false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xbc,pcVar2);
          testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
          testing::internal::AssertHelper::~AssertHelper(&local_2e0);
          std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_2d8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_msg_next_attr(gtest_ar_.message_.ptr_,gtest_ar_4.message_.ptr_);
        local_314 = STUN_ATTR_PRIORITY;
        local_316 = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                  ((EqHelper<false> *)local_310,"STUN_ATTR_PRIORITY","stun_attr_type(attr_hdr)",
                   &local_314,&local_316);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
        if (!bVar1) {
          testing::Message::Message(&local_320);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xbf,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_7.message_,&local_320);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
          testing::Message::~Message(&local_320);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
        local_340 = 0x6e0001ff;
        local_344 = stun_attr_uint32_read((stun_attr_uint32 *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
                  ((EqHelper<false> *)local_338,"0x6e0001fful",
                   "stun_attr_uint32_read((stun_attr_uint32*)attr_hdr)",&local_340,&local_344);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
        if (!bVar1) {
          testing::Message::Message(&local_350);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xc0,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_8.message_,&local_350);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
          testing::Message::~Message(&local_350);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_msg_next_attr(gtest_ar_.message_.ptr_,gtest_ar_4.message_.ptr_);
        local_36c = STUN_ATTR_ICE_CONTROLLED;
        local_36e = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                  ((EqHelper<false> *)local_368,"STUN_ATTR_ICE_CONTROLLED",
                   "stun_attr_type(attr_hdr)",&local_36c,&local_36e);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
        if (!bVar1) {
          testing::Message::Message(&local_378);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xc3,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_9.message_,&local_378);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
          testing::Message::~Message(&local_378);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
        local_398 = 0x932ff9b151263b36;
        local_3a0 = stun_attr_uint64_read((stun_attr_uint64 *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<unsigned_long_long,unsigned_long>
                  ((EqHelper<false> *)local_390,"0x932ff9b151263b36ull",
                   "stun_attr_uint64_read((stun_attr_uint64*)attr_hdr)",&local_398,&local_3a0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
        if (!bVar1) {
          testing::Message::Message(&local_3a8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xc5,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_10.message_,&local_3a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
          testing::Message::~Message(&local_3a8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_msg_next_attr(gtest_ar_.message_.ptr_,gtest_ar_4.message_.ptr_);
        local_3c4 = STUN_ATTR_USERNAME;
        local_3c6 = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                  ((EqHelper<false> *)local_3c0,"STUN_ATTR_USERNAME","stun_attr_type(attr_hdr)",
                   &local_3c4,&local_3c6);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
        if (!bVar1) {
          testing::Message::Message(&local_3d0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,200,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_11.message_,&local_3d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
          testing::Message::~Message(&local_3d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
        local_3f0 = 9;
        local_3f8 = stun_attr_len((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                  ((EqHelper<false> *)local_3e8,"sizeof(username)-1","stun_attr_len(attr_hdr)",
                   &local_3f0,&local_3f8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
        if (!bVar1) {
          testing::Message::Message(&local_400);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xc9,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__2.message_,&local_400);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
          testing::Message::~Message(&local_400);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          gtest_ar__1.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               stun_attr_varsize_read(gtest_ar_4.message_.ptr_);
          anon_unknown.dwarf_39c4::IsEqual
                    ((anon_unknown_dwarf_39c4 *)local_418,gtest_ar__1.message_.ptr_,&local_38,9);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
          if (!bVar1) {
            testing::Message::Message(&local_420);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_12.message_,(internal *)local_418,
                       (AssertionResult *)"IsEqual(data, username, sizeof(username)-1)","false",
                       "true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_428,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xcb,pcVar2);
            testing::internal::AssertHelper::operator=(&local_428,&local_420);
            testing::internal::AssertHelper::~AssertHelper(&local_428);
            std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
            testing::Message::~Message(&local_420);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
          gtest_ar_4.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               stun_msg_next_attr(gtest_ar_.message_.ptr_,gtest_ar_4.message_.ptr_);
          local_45c = STUN_ATTR_MESSAGE_INTEGRITY;
          local_45e = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
          testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                    ((EqHelper<false> *)local_458,"STUN_ATTR_MESSAGE_INTEGRITY",
                     "stun_attr_type(attr_hdr)",&local_45c,&local_45e);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
          if (!bVar1) {
            testing::Message::Message(&local_468);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xce,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_13.message_,&local_468);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
            testing::Message::~Message(&local_468);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
          local_488[1] = 1;
          local_488[0] = stun_attr_msgint_check
                                   ((stun_attr_msgint *)gtest_ar_4.message_.ptr_,
                                    (stun_msg_hdr *)gtest_ar_.message_.ptr_,expected_result + 0x68,
                                    0x16);
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((EqHelper<false> *)local_480,"1",
                     "stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr, (uint8_t*)password, sizeof(password)-1)"
                     ,local_488 + 1,local_488);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
          if (!bVar1) {
            testing::Message::Message(&local_490);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xd0,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_14.message_,&local_490);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
            testing::Message::~Message(&local_490);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
          gtest_ar_4.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               stun_msg_next_attr(gtest_ar_.message_.ptr_,gtest_ar_4.message_.ptr_);
          local_4ac = STUN_ATTR_FINGERPRINT;
          local_4ae = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
          testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                    ((EqHelper<false> *)local_4a8,"STUN_ATTR_FINGERPRINT","stun_attr_type(attr_hdr)"
                     ,&local_4ac,&local_4ae);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
          if (!bVar1) {
            testing::Message::Message(&local_4b8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xd3,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_15.message_,&local_4b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
            testing::Message::~Message(&local_4b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
          gtest_ar_4.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               stun_msg_next_attr(gtest_ar_.message_.ptr_,gtest_ar_4.message_.ptr_);
          testing::internal::EqHelper<true>::Compare<_stun_attr_hdr_const>
                    ((EqHelper<true> *)local_4d0,"__null","attr_hdr",(Secret *)0x0,
                     (_stun_attr_hdr *)gtest_ar_4.message_.ptr_);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
          if (!bVar1) {
            testing::Message::Message(&local_4d8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
            testing::internal::AssertHelper::AssertHelper
                      (&local_4e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xd6,pcVar2);
            testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
            testing::internal::AssertHelper::~AssertHelper(&local_4e0);
            testing::Message::~Message(&local_4d8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(StunMsg, RFC5769SampleRequest) {
  const char software_name[] = "STUN test client";
  const char username[] = "evtj:h6vY";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x00,0x01,0x00,0x58, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x10, //    SOFTWARE attribute header
    0x53,0x54,0x55,0x4e, // }
    0x20,0x74,0x65,0x73, // }  User-agent...
    0x74,0x20,0x63,0x6c, // }  ...name
    0x69,0x65,0x6e,0x74, // }
    0x00,0x24,0x00,0x04, //    PRIORITY attribute header
    0x6e,0x00,0x01,0xff, //    ICE priority value
    0x80,0x29,0x00,0x08, //    ICE-CONTROLLED attribute header
    0x93,0x2f,0xf9,0xb1, // }  Pseudo-random tie breaker...
    0x51,0x26,0x3b,0x36, // }   ...for ICE control
    0x00,0x06,0x00,0x09, //    USERNAME attribute header
    0x65,0x76,0x74,0x6a, // }
    0x3a,0x68,0x36,0x76, // }  Username (9 bytes) and padding (3 bytes)
    0x59,0x20,0x20,0x20, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x9a,0xea,0xa7,0x0c, // }
    0xbf,0xd8,0xcb,0x56, // }
    0x78,0x1e,0xf2,0xb5, // }  HMAC-SHA1 fingerprint
    0xb2,0xd3,0xf2,0x49, // }
    0xc1,0xb5,0x71,0xa2, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xe5,0x7a,0x3b,0xcf, //    CRC0x32, fingerprint
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_VARSIZE_SIZE(sizeof(software_name) - 1)
    + STUN_ATTR_UINT32_SIZE
    + STUN_ATTR_UINT64_SIZE
    + STUN_ATTR_VARSIZE_SIZE(sizeof(username) - 1)
    + STUN_ATTR_MSGINT_SIZE
    + STUN_ATTR_FINGERPRINT_SIZE];

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  stun_msg_hdr_init(msg_hdr, STUN_BINDING_REQUEST, tsx_id);  
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_SOFTWARE, software_name,
        sizeof(software_name)-1, ' ');
  stun_attr_uint32_add(msg_hdr, STUN_ATTR_PRIORITY, 0x6e0001fful);
  stun_attr_uint64_add(msg_hdr, STUN_ATTR_ICE_CONTROLLED, 0x932ff9b151263b36ull);
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_USERNAME, username,
        sizeof(username)-1, ' ');
  stun_attr_msgint_add(msg_hdr, password, sizeof(password)-1);
  stun_attr_fingerprint_add(msg_hdr);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_REQUEST, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_SOFTWARE, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(software_name)-1, stun_attr_len(attr_hdr));
  const void* data = (uint8_t*)stun_attr_varsize_read(
    (stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, software_name, sizeof(software_name)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_PRIORITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(0x6e0001fful, stun_attr_uint32_read((stun_attr_uint32*)attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_ICE_CONTROLLED, stun_attr_type(attr_hdr));
  EXPECT_EQ(0x932ff9b151263b36ull,
      stun_attr_uint64_read((stun_attr_uint64*)attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_USERNAME, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(username)-1, stun_attr_len(attr_hdr));
  data = stun_attr_varsize_read((stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, username, sizeof(username)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_MESSAGE_INTEGRITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(1, stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr,
      (uint8_t*)password, sizeof(password)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_FINGERPRINT, stun_attr_type(attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}